

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

void __thiscall cxxopts::exceptions::exception::~exception(exception *this)

{
  *(undefined ***)this = &PTR__exception_002404c8;
  std::__cxx11::string::~string((string *)&this->m_message);
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

explicit exception(std::string  message)
  : m_message(std::move(message))
  {
  }